

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Track::set_language(Track *this,char *language)

{
  size_t __n;
  char *__dest;
  
  if (language != (char *)0x0) {
    if (this->language_ != (char *)0x0) {
      operator_delete__(this->language_);
    }
    __n = strlen(language);
    __dest = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    this->language_ = __dest;
    if (__dest != (char *)0x0) {
      memcpy(__dest,language,__n);
      __dest[__n] = '\0';
    }
  }
  return;
}

Assistant:

void Track::set_language(const char* language) {
  if (language) {
    delete[] language_;

    const size_t length = strlen(language) + 1;
    language_ = new (std::nothrow) char[length];  // NOLINT
    if (language_) {
      memcpy(language_, language, length - 1);
      language_[length - 1] = '\0';
    }
  }
}